

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_parse_dns(char *buf,int len,mg_dns_message *msg)

{
  ushort uVar1;
  uchar *data;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  mg_dns_resource_record *pmVar5;
  int iVar6;
  
  (msg->pkt).p = buf;
  (msg->pkt).len = (long)len;
  iVar6 = -1;
  if (0xb < len) {
    msg->transaction_id = *(uint16_t *)buf;
    msg->flags = *(ushort *)(buf + 2) << 8 | *(ushort *)(buf + 2) >> 8;
    uVar1 = *(ushort *)(buf + 4);
    msg->num_questions = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    uVar2 = *(ushort *)(buf + 6) << 8 | *(ushort *)(buf + 6) >> 8;
    data = (uchar *)(buf + 0xc);
    uVar3 = (uint)uVar2;
    msg->num_answers = (uint)uVar2;
    if (uVar1 != 0) {
      pmVar5 = msg->questions;
      uVar4 = 0;
      do {
        data = mg_parse_dns_resource_record(data,(uchar *)(buf + len),pmVar5,0);
        if (0x1e < uVar4) break;
        uVar4 = uVar4 + 1;
        pmVar5 = pmVar5 + 1;
      } while ((long)uVar4 < (long)msg->num_questions);
      uVar3 = msg->num_answers;
    }
    if ((int)uVar3 < 1) {
      iVar6 = 0;
    }
    else {
      pmVar5 = msg->answers;
      iVar6 = 0;
      uVar4 = 0;
      do {
        data = mg_parse_dns_resource_record(data,(uchar *)(buf + len),pmVar5,1);
        if (0x1e < uVar4) {
          return 0;
        }
        uVar4 = uVar4 + 1;
        pmVar5 = pmVar5 + 1;
      } while ((long)uVar4 < (long)msg->num_answers);
    }
  }
  return iVar6;
}

Assistant:

int mg_parse_dns(const char *buf, int len, struct mg_dns_message *msg) {
    struct mg_dns_header *header = (struct mg_dns_header *) buf;
    unsigned char *data = (unsigned char *) buf + sizeof(*header);
    unsigned char *end = (unsigned char *) buf + len;
    int i;
    msg->pkt.p = buf;
    msg->pkt.len = len;

    if (len < (int) sizeof(*header)) {
        return -1; /* LCOV_EXCL_LINE */
    }

    msg->transaction_id = header->transaction_id;
    msg->flags = ntohs(header->flags);
    msg->num_questions = ntohs(header->num_questions);
    msg->num_answers = ntohs(header->num_answers);

    for (i = 0; i < msg->num_questions && i < (int) ARRAY_SIZE(msg->questions);
         i++) {
        data = mg_parse_dns_resource_record(data, end, &msg->questions[i], 0);
    }

    for (i = 0; i < msg->num_answers && i < (int) ARRAY_SIZE(msg->answers); i++) {
        data = mg_parse_dns_resource_record(data, end, &msg->answers[i], 1);
    }

    return 0;
}